

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECPublicKey.cpp
# Opt level: O1

bool __thiscall ECPublicKey::deserialise(ECPublicKey *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dQ;
  ByteString dEC;
  ByteString local_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&local_68,serialised);
  sVar1 = ByteString::size(&local_40);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&local_68);
    if (sVar1 != 0) {
      (**(code **)(*(long *)this + 0x38))(this,&local_40);
      bVar2 = true;
      (**(code **)(*(long *)this + 0x40))(this,&local_68);
      goto LAB_001501c4;
    }
  }
  bVar2 = false;
LAB_001501c4:
  local_68._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_68.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_40.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return bVar2;
}

Assistant:

bool ECPublicKey::deserialise(ByteString& serialised)
{
	ByteString dEC = ByteString::chainDeserialise(serialised);
	ByteString dQ = ByteString::chainDeserialise(serialised);

	if ((dEC.size() == 0) ||
	    (dQ.size() == 0))
	{
		return false;
	}

	setEC(dEC);
	setQ(dQ);

	return true;
}